

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_ObjName(Bac_Ntk_t *p,int i)

{
  int iVar1;
  undefined4 local_18;
  int i_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIsCo(p,i);
  if (iVar1 == 0) {
    local_18 = Bac_ObjNameInt(p,i);
  }
  else {
    iVar1 = Bac_ObjFanin(p,i);
    local_18 = Bac_ObjNameInt(p,iVar1);
  }
  return local_18;
}

Assistant:

static inline int            Bac_ObjName( Bac_Ntk_t * p, int i )             { return Bac_ObjIsCo(p, i) ? Bac_ObjNameInt(p, Bac_ObjFanin(p,i)) : Bac_ObjNameInt(p, i);     }